

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeSwitch(TranslateToFuzzReader *this,Type type)

{
  Expression *target_00;
  bool bVar1;
  value_type *ppEVar2;
  size_type sVar3;
  reference pvVar4;
  int iVar5;
  Name NVar6;
  Expression *local_138;
  Expression *temp2;
  Expression *local_b0;
  Expression *temp1;
  value_type default_;
  Type local_88;
  Type currValueType;
  Name name;
  Expression *target;
  Type local_58;
  Type valueType;
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  int tries;
  BasicType local_24;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_24 = unreachable;
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,&local_24);
  if (!bVar1) {
    __assert_fail("type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x10eb,"Expression *wasm::TranslateToFuzzReader::makeSwitch(Type)");
  }
  bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                    (&this->funcContext->breakableStack);
  if (bVar1) {
    type_local.id = (uintptr_t)make(this,(Type)this_local);
  }
  else {
    names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (this->fuzzParams->super_FuzzParams).TRIES;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&valueType);
    Type::Type(&local_58,unreachable);
LAB_001c25f6:
    iVar5 = names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
    if (0 < names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_) {
      ppEVar2 = pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          (this,&this->funcContext->breakableStack);
      target_00 = *ppEVar2;
      NVar6 = getTargetName(this,target_00);
      currValueType.id = NVar6.super_IString.str._M_len;
      local_88 = getTargetType(this,target_00);
      bVar1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::empty
                        ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&valueType);
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = iVar5;
      if (!bVar1) goto LAB_001c26c5;
      local_58.id = local_88.id;
      goto LAB_001c26ed;
    }
    sVar3 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                      ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&valueType);
    if (sVar3 < 2) {
      type_local.id = (uintptr_t)make(this,(Type)this_local);
    }
    else {
      pvVar4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::back
                         ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&valueType);
      temp1 = (Expression *)(pvVar4->super_IString).str._M_len;
      default_.super_IString.str._M_len = (size_t)(pvVar4->super_IString).str._M_str;
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::pop_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&valueType);
      Type::Type((Type *)&temp2,i32);
      local_b0 = make(this,(Type)temp2);
      bVar1 = Type::isConcrete(&local_58);
      if (bVar1) {
        local_138 = make(this,local_58);
      }
      else {
        local_138 = (Expression *)0x0;
      }
      NVar6.super_IString.str._M_str = (char *)default_.super_IString.str._M_len;
      NVar6.super_IString.str._M_len = (size_t)temp1;
      type_local.id =
           (uintptr_t)
           Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                     (&this->builder,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)&valueType,
                      NVar6,local_b0,local_138);
    }
    default_.super_IString.str._M_str._4_4_ = 1;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&valueType);
  }
  return (Expression *)type_local.id;
LAB_001c26c5:
  bVar1 = Type::operator!=(&local_58,&local_88);
  if (!bVar1) {
LAB_001c26ed:
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&valueType,
               (value_type *)&currValueType);
  }
  goto LAB_001c25f6;
}

Assistant:

Expression* TranslateToFuzzReader::makeSwitch(Type type) {
  assert(type == Type::unreachable);
  if (funcContext->breakableStack.empty()) {
    return make(type);
  }
  // we need to find proper targets to break to; try a bunch
  int tries = fuzzParams->TRIES;
  std::vector<Name> names;
  Type valueType = Type::unreachable;
  while (tries-- > 0) {
    auto* target = pick(funcContext->breakableStack);
    auto name = getTargetName(target);
    auto currValueType = getTargetType(target);
    if (names.empty()) {
      valueType = currValueType;
    } else {
      if (valueType != currValueType) {
        continue; // all values must be the same
      }
    }
    names.push_back(name);
  }
  if (names.size() < 2) {
    // we failed to find enough
    return make(type);
  }
  auto default_ = names.back();
  names.pop_back();
  auto temp1 = make(Type::i32),
       temp2 = valueType.isConcrete() ? make(valueType) : nullptr;
  return builder.makeSwitch(names, default_, temp1, temp2);
}